

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

Boolean MA_allocate_heap(Integer datatype,Integer nelem,char *name,Integer *memhandle)

{
  Pointer pcVar1;
  Pointer func;
  ulongi uVar2;
  Integer IVar3;
  Integer *in_RCX;
  undefined8 in_RDX;
  ulong in_RSI;
  long in_RDI;
  Pointer new_hp;
  ulongi nbytes;
  Pointer client_space;
  AD *ad;
  AR ar;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  ErrorType in_stack_ffffffffffffffb0;
  ErrorLevel in_stack_ffffffffffffffb4;
  AD **in_stack_ffffffffffffffb8;
  AD *local_40;
  AR local_38;
  Integer *local_28;
  undefined8 local_20;
  ulong local_18;
  long local_10;
  Boolean local_8;
  
  ma_stats.calls[1] = ma_stats.calls[1] + 1;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (ma_trace != 0) {
    printf("MA: allocating \'%s\' (%d)\n",in_RDX,in_RSI & 0xffffffff);
  }
  if (ma_initialized == 0) {
    sprintf(ma_ebuf,"block \'%s\', MA not yet initialized",local_20);
    ma_error(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0);
    local_8 = 0;
  }
  else if ((local_10 < 1000) || (0x3f8 < local_10)) {
    sprintf(ma_ebuf,"block \'%s\', invalid datatype: %ld",local_20,local_10);
    ma_error(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0);
    local_8 = 0;
  }
  else if ((long)local_18 < 0) {
    sprintf(ma_ebuf,"block \'%s\', invalid nelem: %ld",local_20,local_18);
    ma_error(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0);
    local_8 = 0;
  }
  else {
    local_38.datatype = local_10 + -1000;
    local_38.nelem = local_18;
    local_10 = local_38.datatype;
    local_40 = list_delete_one(in_stack_ffffffffffffffb8,
                               (_func_Boolean_AD_ptr_Pointer *)
                               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                               in_stack_ffffffffffffffa8);
    if (local_40 == (AD *)0x0) {
      balloc_after(&local_38,ma_hp,(Pointer *)&stack0xffffffffffffffb8,
                   (ulongi *)&stack0xffffffffffffffb0);
      pcVar1 = ma_hp;
      func = ma_hp + CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
      if (ma_sp < func) {
        sprintf(ma_ebuf,"block \'%s\', not enough space to allocate %lu bytes",local_20,
                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        ma_error(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,func,in_stack_ffffffffffffffa0)
        ;
        return 0;
      }
      local_40 = (AD *)ma_hp;
      *(AD ***)(ma_hp + 0x30) = in_stack_ffffffffffffffb8;
      *(ulong *)(pcVar1 + 0x38) = CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
    }
    local_40->datatype = local_10;
    local_40->nelem = local_18;
    str_ncopy(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0);
    list_insert(local_40,&ma_hused);
    uVar2 = checksum(local_40);
    local_40->checksum = uVar2;
    guard_set(local_40);
    if (ma_hp < local_40->name + (local_40->nbytes - 0x10)) {
      ma_hp = local_40->name + (local_40->nbytes - 0x10);
    }
    ma_stats.hblocks = ma_stats.hblocks + 1;
    uVar2 = ma_stats.hblocks;
    if (ma_stats.hblocks < ma_stats.hblocks_max) {
      uVar2 = ma_stats.hblocks_max;
    }
    ma_stats.hblocks_max = uVar2;
    ma_stats.hbytes = local_40->nbytes + ma_stats.hbytes;
    uVar2 = ma_stats.hbytes;
    if (ma_stats.hbytes < ma_stats.hbytes_max) {
      uVar2 = ma_stats.hbytes_max;
    }
    ma_stats.hbytes_max = uVar2;
    IVar3 = ma_table_allocate((TableData)in_stack_ffffffffffffffb8);
    *local_28 = IVar3;
    if (IVar3 == -1) {
      local_8 = 0;
    }
    else {
      local_8 = 1;
    }
  }
  return local_8;
}

Assistant:

public Boolean MA_allocate_heap(
    Integer    datatype,    /* of elements in this block */
    Integer    nelem,        /* # of elements in this block */
    const char    *name,        /* assigned to this block by client */
    Integer    *memhandle    /* RETURN: handle for this block */ )
{
    AR        ar;        /* allocation request */
    AD        *ad;        /* AD for newly allocated block */
    Pointer    client_space;    /* location of client_space */
    ulongi    nbytes;        /* length of block for ar */
    Pointer    new_hp;        /* new ma_hp */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_allocate_heap]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    if (ma_trace) 
    (void)printf("MA: allocating '%s' (%d)\n", name, (int)nelem);

    /* verify initialization */
    if (!ma_initialized)
    {
        (void)sprintf(ma_ebuf,
            "block '%s', MA not yet initialized",
            name);
        ma_error(EL_Nonfatal, ET_External, "MA_allocate_heap", ma_ebuf);
        return MA_FALSE;
    }

    /* verify datatype */
    if (!mt_valid(datatype))
    {
        (void)sprintf(ma_ebuf,
            "block '%s', invalid datatype: %ld",
            name, (size_t)datatype);
        ma_error(EL_Nonfatal, ET_External, "MA_allocate_heap", ma_ebuf);
        return MA_FALSE;
    }

    /* verify nelem */
    if (nelem < 0)
    {
        (void)sprintf(ma_ebuf,
            "block '%s', invalid nelem: %ld",
            name, (size_t)nelem);
        ma_error(EL_Nonfatal, ET_External, "MA_allocate_heap", ma_ebuf);
        return MA_FALSE;
    }

    /* convert datatype to internal (index-suitable) value */
    datatype = mt_import(datatype);

    /*
     * attempt to allocate space
     */

    ar.datatype = datatype;
    ar.nelem = nelem;

    /* search the free list */
    ad = list_delete_one(&ma_hfree, ad_big_enough, (Pointer)&ar);

    /* if search of free list failed, try expanding heap region */
    if (ad == (AD *)NULL)
    {
        /* perform trial allocation to determine size */
        balloc_after(&ar, ma_hp, &client_space, &nbytes);

        new_hp = ma_hp + nbytes;
        if (new_hp > ma_sp)
        {
            (void)sprintf(ma_ebuf,
                "block '%s', not enough space to allocate %lu bytes",
                name, nbytes);
            ma_error(EL_Nonfatal, ET_External, "MA_allocate_heap", ma_ebuf);
            return MA_FALSE;
        }
        else
        {
            /* heap region expanded successfully */
            ad = (AD *)ma_hp;

            /* set fields appropriately */
            ad->client_space = client_space;
            ad->nbytes = nbytes;
        }
    }

    /*
     * space has been allocated
     */

    /* initialize the AD */
    ad->datatype = datatype;
    ad->nelem = nelem;
    str_ncopy(ad->name, (char*)name, MA_NAMESIZE);
    /* ad->client_space is already set */
    /* ad->nbytes is already set */
    list_insert(ad, &ma_hused);
    ad->checksum = checksum(ad);

    /* set the guards */
    guard_set(ad);

#ifdef DEBUG
    debug_ad_print(ad);
#endif /* DEBUG */

    /* update ma_hp if necessary */
    new_hp = (Pointer)ad + ad->nbytes;
    if (new_hp > ma_hp)
    {
        ma_hp = new_hp;
    }

#ifdef STATS
    ma_stats.hblocks++;
    ma_stats.hblocks_max = max(ma_stats.hblocks, ma_stats.hblocks_max);
    ma_stats.hbytes += ad->nbytes;
    ma_stats.hbytes_max = max(ma_stats.hbytes, ma_stats.hbytes_max);
#endif /* STATS */

    /* convert AD to memhandle */
    if ((*memhandle = ma_table_allocate((TableData)ad)) == TABLE_HANDLE_NONE)
        /* failure */
        return MA_FALSE;
    else
        /* success */
        return MA_TRUE;
}